

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser.cc
# Opt level: O3

bool __thiscall
ManifestParser::Parse(ManifestParser *this,string *filename,string *input,string *err)

{
  Lexer *this_00;
  StringPiece filename_00;
  StringPiece input_00;
  bool bVar1;
  Token t;
  int iVar2;
  long *plVar3;
  ulong *puVar4;
  _Alloc_hider _Var5;
  string name;
  string value;
  EvalString let_value;
  string local_88;
  string local_68;
  EvalString local_48;
  
  this_00 = &(this->super_Parser).lexer_;
  filename_00.str_ = (filename->_M_dataplus)._M_p;
  filename_00.len_ = filename->_M_string_length;
  input_00.str_ = (input->_M_dataplus)._M_p;
  input_00.len_ = input->_M_string_length;
  Lexer::Start(this_00,filename_00,input_00);
switchD_0011e2ba_caseD_8:
  t = Lexer::ReadToken(this_00);
  switch(t) {
  case ERROR:
    goto switchD_0011e2ba_caseD_0;
  case BUILD:
    bVar1 = ParseEdge(this,err);
    break;
  default:
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"unexpected ","");
    Lexer::TokenName(t);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_68);
    puVar4 = (ulong *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar4) {
      local_88.field_2._M_allocated_capacity = *puVar4;
      local_88.field_2._8_8_ = plVar3[3];
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    }
    else {
      local_88.field_2._M_allocated_capacity = *puVar4;
      local_88._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_88._M_string_length = plVar3[1];
    *plVar3 = (long)puVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    bVar1 = Lexer::Error(this_00,&local_88,err);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    _Var5._M_p = local_68._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) {
      return bVar1;
    }
    goto LAB_0011e4f9;
  case DEFAULT:
    bVar1 = ParseDefault(this,err);
    break;
  case IDENT:
    Lexer::UnreadToken(this_00);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    local_88._M_string_length = 0;
    local_88.field_2._M_allocated_capacity =
         local_88.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_48.parsed_.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48.parsed_.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.parsed_.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    bVar1 = ParseLet(this,&local_88,&local_48,err);
    if (bVar1) {
      EvalString::Evaluate_abi_cxx11_(&local_68,&local_48,&this->env_->super_Env);
      iVar2 = std::__cxx11::string::compare((char *)&local_88);
      if (iVar2 == 0) {
        CheckNinjaVersion(&local_68);
      }
      BindingEnv::AddBinding(this->env_,&local_88,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
    ::~vector(&local_48.parsed_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if (!bVar1) {
      return false;
    }
    goto switchD_0011e2ba_caseD_8;
  case INCLUDE:
    goto switchD_0011e2ba_caseD_6;
  case NEWLINE:
    goto switchD_0011e2ba_caseD_8;
  case POOL:
    bVar1 = ParsePool(this,err);
    break;
  case RULE:
    bVar1 = ParseRule(this,err);
    break;
  case SUBNINJA:
    bVar1 = ParseFileInclude(this,true,err);
    break;
  case TEOF:
    return true;
  }
  if (bVar1 == false) {
    return false;
  }
  goto switchD_0011e2ba_caseD_8;
switchD_0011e2ba_caseD_6:
  bVar1 = ParseFileInclude(this,false,err);
  if (!bVar1) {
    return false;
  }
  goto switchD_0011e2ba_caseD_8;
switchD_0011e2ba_caseD_0:
  Lexer::DescribeLastError_abi_cxx11_(&local_88,this_00);
  bVar1 = Lexer::Error(this_00,&local_88,err);
  local_68.field_2._M_allocated_capacity = local_88.field_2._M_allocated_capacity;
  _Var5._M_p = local_88._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
LAB_0011e4f9:
    operator_delete(_Var5._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool ManifestParser::Parse(const string& filename, const string& input,
                           string* err) {
  lexer_.Start(filename, input);

  for (;;) {
    Lexer::Token token = lexer_.ReadToken();
    switch (token) {
    case Lexer::POOL:
      if (!ParsePool(err))
        return false;
      break;
    case Lexer::BUILD:
      if (!ParseEdge(err))
        return false;
      break;
    case Lexer::RULE:
      if (!ParseRule(err))
        return false;
      break;
    case Lexer::DEFAULT:
      if (!ParseDefault(err))
        return false;
      break;
    case Lexer::IDENT: {
      lexer_.UnreadToken();
      string name;
      EvalString let_value;
      if (!ParseLet(&name, &let_value, err))
        return false;
      string value = let_value.Evaluate(env_);
      // Check ninja_required_version immediately so we can exit
      // before encountering any syntactic surprises.
      if (name == "ninja_required_version")
        CheckNinjaVersion(value);
      env_->AddBinding(name, value);
      break;
    }
    case Lexer::INCLUDE:
      if (!ParseFileInclude(false, err))
        return false;
      break;
    case Lexer::SUBNINJA:
      if (!ParseFileInclude(true, err))
        return false;
      break;
    case Lexer::ERROR: {
      return lexer_.Error(lexer_.DescribeLastError(), err);
    }
    case Lexer::TEOF:
      return true;
    case Lexer::NEWLINE:
      break;
    default:
      return lexer_.Error(string("unexpected ") + Lexer::TokenName(token),
                          err);
    }
  }
  return false;  // not reached
}